

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformed_fetcher<(TextureBlendType)2,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  uchar *puVar7;
  double dVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  QSpanData *pQVar17;
  long length_00;
  int iVar18;
  int iVar19;
  uint uVar20;
  double dVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar29;
  int iVar30;
  undefined1 auVar28 [16];
  double dVar31;
  double dVar32;
  uint uVar33;
  double dVar34;
  uint uVar35;
  
  dVar32 = (double)x + 0.5;
  dVar21 = (double)y + 0.5;
  length_00 = (long)length;
  pQVar17 = data;
  bVar9 = canUseFastMatrixPath(dVar32,dVar21,length_00,data);
  dVar2 = data->m11;
  if (!bVar9) {
    dVar3 = data->m13;
    dVar4 = data->m12;
    dVar34 = dVar21 * data->m23 + dVar32 * dVar3 + data->m33;
    dVar31 = data->dx + dVar21 * data->m21 + dVar32 * dVar2;
    dVar32 = data->dy + dVar21 * data->m22 + dVar32 * dVar4;
    puVar1 = buffer + length_00;
    for (; buffer < puVar1; buffer = buffer + 1) {
      dVar8 = (double)(-(ulong)(dVar34 == 0.0) & 0x3ff0000000000000 |
                      ~-(ulong)(dVar34 == 0.0) & (ulong)(1.0 / dVar34));
      dVar21 = floor(dVar31 * dVar8);
      dVar8 = floor(dVar32 * dVar8);
      iVar18 = (data->field_23).texture.y1;
      iVar19 = (data->field_23).texture.y2 + -1;
      if ((int)dVar8 <= iVar19) {
        iVar19 = (int)dVar8;
      }
      if (iVar19 <= iVar18) {
        iVar19 = iVar18;
      }
      iVar18 = (data->field_23).texture.x2 + -1;
      if ((int)dVar21 <= iVar18) {
        iVar18 = (int)dVar21;
      }
      iVar30 = (data->field_23).texture.x1;
      if (iVar18 <= iVar30) {
        iVar18 = iVar30;
      }
      *buffer = *(uint *)((data->field_23).texture.imageData +
                         (long)iVar18 * 4 + (long)iVar19 * (data->field_23).texture.bytesPerLine);
      dVar31 = dVar31 + dVar2;
      dVar32 = dVar32 + dVar4;
      dVar34 = dVar34 + dVar3;
      dVar34 = (double)((ulong)dVar34 & -(ulong)(dVar34 != 0.0) |
                       ~-(ulong)(dVar34 != 0.0) & (ulong)(dVar3 + dVar34));
    }
    return;
  }
  uVar20 = (uint)(dVar2 * 65536.0);
  uVar22 = (uint)(data->m12 * 65536.0);
  iVar18 = (int)((data->dx + data->m21 * dVar21 + dVar32 * dVar2) * 65536.0);
  iVar19 = (int)((data->dy + data->m22 * dVar21 + dVar32 * data->m12) * 65536.0);
  if (uVar22 == 0) {
    iVar30 = (data->field_23).texture.y2 + -1;
    if (iVar19 >> 0x10 <= iVar30) {
      iVar30 = iVar19 >> 0x10;
    }
    iVar19 = (data->field_23).texture.y1;
    if (iVar30 <= iVar19) {
      iVar30 = iVar19;
    }
    lVar12 = (long)iVar30 * (data->field_23).texture.bytesPerLine;
    puVar7 = (data->field_23).texture.imageData;
    if ((int)uVar20 < 1) {
      if (-1 < (int)uVar20) goto LAB_005ad6c7;
      lVar13 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar18;
      uVar14 = (ulong)(int)uVar20;
    }
    else {
      lVar13 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar18) + -0x10000;
      uVar14 = (ulong)uVar20;
    }
    uVar22 = (uint)(lVar13 / (long)uVar14);
    if ((int)uVar22 < length) {
      length = uVar22;
    }
LAB_005ad6c7:
    uVar16 = 0;
    uVar14 = 0;
    if (0 < length) {
      uVar14 = (ulong)(uint)length;
    }
    for (; uVar15 = uVar14, uVar14 != uVar16; uVar16 = uVar16 + 1) {
      iVar11 = iVar18 >> 0x10;
      iVar19 = (data->field_23).texture.x1;
      iVar30 = (data->field_23).texture.x2 + -1;
      if (iVar11 <= iVar30) {
        iVar30 = iVar11;
      }
      if (iVar30 <= iVar19) {
        iVar30 = iVar19;
      }
      uVar15 = uVar16;
      if (iVar30 == iVar11) break;
      buffer[uVar16] = *(uint *)(puVar7 + (long)iVar30 * 4 + lVar12);
      iVar18 = iVar18 + uVar20;
    }
    for (; (long)uVar15 < (long)length; uVar15 = uVar15 + 1) {
      buffer[uVar15] = *(uint *)(puVar7 + (long)(iVar18 >> 0x10) * 4 + lVar12);
      iVar18 = iVar18 + uVar20;
    }
    for (; (long)uVar15 < length_00; uVar15 = uVar15 + 1) {
      iVar19 = (data->field_23).texture.x1;
      iVar30 = (data->field_23).texture.x2 + -1;
      if (iVar18 >> 0x10 <= iVar30) {
        iVar30 = iVar18 >> 0x10;
      }
      if (iVar30 <= iVar19) {
        iVar30 = iVar19;
      }
      buffer[uVar15] = *(uint *)(puVar7 + (long)iVar30 * 4 + lVar12);
      iVar18 = iVar18 + uVar20;
    }
    return;
  }
  if ((int)uVar20 < 1) {
    if (-1 < (int)uVar20) goto LAB_005ad518;
    lVar12 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar18;
    pQVar17 = (QSpanData *)(long)(int)uVar20;
  }
  else {
    lVar12 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar18) + -0x10000;
    pQVar17 = (QSpanData *)(ulong)uVar20;
  }
  uVar10 = (uint)(lVar12 / (long)pQVar17);
  if ((int)uVar10 < length) {
    length = uVar10;
  }
LAB_005ad518:
  if ((int)uVar22 < 1) {
    lVar12 = (long)(data->field_23).texture.y1 * 0x10000 - (long)iVar19;
    uVar14 = (ulong)(int)uVar22;
  }
  else {
    lVar12 = ((long)(data->field_23).texture.y2 * 0x10000 - (long)iVar19) + -0x10000;
    uVar14 = (ulong)uVar22;
  }
  uVar10 = (uint)(lVar12 / (long)uVar14);
  if (length < (int)uVar10) {
    uVar10 = length;
  }
  uVar16 = 0;
  uVar14 = 0;
  if (0 < (int)uVar10) {
    uVar14 = (ulong)uVar10;
  }
  for (; uVar15 = uVar14, uVar14 != uVar16; uVar16 = uVar16 + 1) {
    uVar27 = iVar18 >> 0x10;
    uVar29 = iVar19 >> 0x10;
    uVar24 = (data->field_23).texture.x1;
    uVar26 = (data->field_23).texture.y1;
    uVar5 = *(undefined8 *)((long)&data->field_23 + 0x18);
    uVar23 = (int)uVar5 - 1;
    uVar25 = (int)((ulong)uVar5 >> 0x20) - 1;
    uVar33 = -(uint)((int)uVar23 < (int)uVar27);
    uVar35 = -(uint)((int)uVar25 < (int)uVar29);
    uVar33 = ~uVar33 & uVar27 | uVar23 & uVar33;
    uVar35 = ~uVar35 & uVar29 | uVar25 & uVar35;
    uVar23 = -(uint)((int)uVar24 < (int)uVar33);
    uVar25 = -(uint)((int)uVar26 < (int)uVar35);
    uVar24 = ~uVar23 & uVar24 | uVar33 & uVar23;
    uVar26 = ~uVar25 & uVar26 | uVar35 & uVar25;
    auVar28._0_4_ = -(uint)(uVar27 == uVar24);
    iVar30 = -(uint)(uVar29 == uVar26);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = iVar30;
    auVar28._12_4_ = iVar30;
    iVar30 = movmskpd((int)pQVar17,auVar28);
    uVar15 = uVar16;
    if (iVar30 == 3) break;
    uVar24 = *(uint *)((data->field_23).texture.imageData +
                      (long)(int)uVar24 * 4 +
                      (long)(int)uVar26 * (data->field_23).texture.bytesPerLine);
    pQVar17 = (QSpanData *)(ulong)uVar24;
    buffer[uVar16] = uVar24;
    iVar18 = iVar18 + uVar20;
    iVar19 = iVar19 + uVar22;
  }
  for (; (long)uVar15 < (long)(int)uVar10; uVar15 = uVar15 + 1) {
    buffer[uVar15] =
         *(uint *)((data->field_23).texture.imageData +
                  (long)(iVar18 >> 0x10) * 4 +
                  (long)(iVar19 >> 0x10) * (data->field_23).texture.bytesPerLine);
    iVar18 = iVar18 + uVar20;
    iVar19 = iVar19 + uVar22;
  }
  for (; (long)uVar15 < length_00; uVar15 = uVar15 + 1) {
    iVar30 = (data->field_23).texture.x2 + -1;
    if (iVar18 >> 0x10 <= iVar30) {
      iVar30 = iVar18 >> 0x10;
    }
    iVar11 = (data->field_23).texture.x1;
    if (iVar30 <= iVar11) {
      iVar30 = iVar11;
    }
    iVar11 = (data->field_23).texture.y2 + -1;
    if (iVar19 >> 0x10 <= iVar11) {
      iVar11 = iVar19 >> 0x10;
    }
    iVar6 = (data->field_23).texture.y1;
    if (iVar11 <= iVar6) {
      iVar11 = iVar6;
    }
    buffer[uVar15] =
         *(uint *)((data->field_23).texture.imageData +
                  (long)iVar30 * 4 + (long)iVar11 * (data->field_23).texture.bytesPerLine);
    iVar18 = iVar18 + uVar20;
    iVar19 = iVar19 + uVar22;
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}